

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O2

void __thiscall ElfSegment::writeData(ElfSegment *this,ByteArray *output)

{
  Elf32_Off *pEVar1;
  uint uVar2;
  Elf32_Off EVar3;
  Elf32_Addr EVar4;
  pointer ppEVar5;
  pointer ppEVar6;
  size_t alignment;
  long lVar7;
  
  ppEVar5 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar5) {
    uVar2 = ((*ppEVar5)->header).sh_addralign;
    alignment = 0x10;
    if (0x10 < (int)uVar2) {
      alignment = (size_t)uVar2;
    }
    ByteArray::alignSize(output,alignment);
    EVar3 = (Elf32_Off)output->size_;
    (this->header).p_offset = EVar3;
    ppEVar5 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppEVar6 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (lVar7 = 0; lVar7 < (int)((ulong)((long)ppEVar6 - (long)ppEVar5) >> 3); lVar7 = lVar7 + 1) {
      pEVar1 = &(ppEVar5[lVar7]->header).sh_offset;
      *pEVar1 = *pEVar1 + EVar3;
    }
    if (this->paddrSection != (ElfSection *)0x0) {
      (this->header).p_paddr = (this->paddrSection->header).sh_offset;
    }
    ByteArray::append(output,&this->data);
    return;
  }
  ByteArray::alignSize(output,(ulong)(this->header).p_align);
  EVar4 = (Elf32_Addr)output->size_;
  if ((this->header).p_offset == (this->header).p_paddr) {
    (this->header).p_paddr = EVar4;
  }
  (this->header).p_offset = EVar4;
  return;
}

Assistant:

void ElfSegment::writeData(ByteArray& output)
{
	if (sections.size() == 0)
	{
		output.alignSize(header.p_align);
		if (header.p_offset == header.p_paddr)
			header.p_paddr = (Elf32_Addr) output.size();

		header.p_offset = (Elf32_Off) output.size();
		return;
	}

	// align segment to alignment of first section
	int align = std::max<int>(sections[0]->getAlignment(),16);
	output.alignSize(align);

	header.p_offset = (Elf32_Off) output.size();
	for (int i = 0; i < (int)sections.size(); i++)
	{
		sections[i]->setOffsetBase(header.p_offset);
	}

	if (paddrSection)
	{
		header.p_paddr = paddrSection->getOffset();
	}

	output.append(data);
}